

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject> *this,BlockLimit *x)

{
  bool bVar1;
  BlockLimit *pBVar2;
  double dVar3;
  BlockLimit *in_RSI;
  BlockLimit *in_RDI;
  DeleteObject deleter;
  
  pBVar2 = get((SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject> *)0x1e4636);
  if ((in_RSI != pBVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject> *)0x1e464c), bVar1))
  {
    release((SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  dVar3 = (double)set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  (in_RDI->avg).avg_ = dVar3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}